

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O0

vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *
dg::pta::getBasicBlocksInDominatorOrder(Function *F)

{
  bool bVar1;
  reference ppDVar2;
  size_type sVar3;
  DominatorTreeWrapperPass *in_RDI;
  DomTreeNodeBase<llvm::BasicBlock> *child;
  iterator __end4;
  iterator __begin4;
  DomTreeNodeBase<llvm::BasicBlock> *__range4;
  DomTreeNodeBase<llvm::BasicBlock> *cur_node;
  iterator __end3;
  iterator __begin3;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  *__range3;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  new_to_process;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  to_process;
  DomTreeNodeBase<llvm::BasicBlock> *root_node;
  DominatorTree *DTree;
  DominatorTreeWrapperPass wrapper;
  vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *blocks;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  *in_stack_fffffffffffffed8;
  DominatorTreeWrapperPass *__x;
  vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
  *in_stack_fffffffffffffef0;
  size_type in_stack_ffffffffffffff08;
  DomTreeNodeBase<llvm::BasicBlock> *in_stack_ffffffffffffff10;
  __normal_iterator<llvm::DomTreeNodeBase<llvm::BasicBlock>_**,_std::vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>_>
  local_d8;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  *local_d0;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  local_b0;
  undefined8 local_98;
  undefined8 local_90;
  DominatorTree *local_88;
  DominatorTreeWrapperPass local_80 [111];
  byte local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::vector
            ((vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *)0x195c61
            );
  llvm::Function::size((Function *)0x195c6e);
  std::vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::reserve
            ((vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  llvm::DominatorTreeWrapperPass::DominatorTreeWrapperPass(local_80);
  llvm::DominatorTreeWrapperPass::runOnFunction((Function *)local_80);
  local_88 = llvm::DominatorTreeWrapperPass::getDomTree(local_80);
  local_90 = llvm::DominatorTreeBase<llvm::BasicBlock,false>::getRootNode();
  local_98 = llvm::DomTreeNodeBase<llvm::BasicBlock>::getBlock();
  std::vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::push_back
            ((vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *)in_RDI,
             (value_type *)in_stack_fffffffffffffed8);
  std::
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::vector((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
            *)0x195cf8);
  std::
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::reserve((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
             *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::push_back((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               *)in_stack_fffffffffffffef0,(value_type *)__x);
  while( true ) {
    bVar1 = std::
            vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
            ::empty((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                     *)in_stack_fffffffffffffef0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::vector((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
              *)0x195d38);
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::size(&local_b0);
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::reserve((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_d0 = &local_b0;
    local_d8._M_current =
         (DomTreeNodeBase<llvm::BasicBlock> **)
         std::
         vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ::begin(in_stack_fffffffffffffed8);
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::end(in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<llvm::DomTreeNodeBase<llvm::BasicBlock>_**,_std::vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>_>
                          *)in_RDI,
                         (__normal_iterator<llvm::DomTreeNodeBase<llvm::BasicBlock>_**,_std::vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      ppDVar2 = __gnu_cxx::
                __normal_iterator<llvm::DomTreeNodeBase<llvm::BasicBlock>_**,_std::vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>_>
                ::operator*(&local_d8);
      in_stack_ffffffffffffff10 = *ppDVar2;
      in_stack_ffffffffffffff08 = llvm::DomTreeNodeBase<llvm::BasicBlock>::begin();
      sVar3 = llvm::DomTreeNodeBase<llvm::BasicBlock>::end();
      for (; in_stack_ffffffffffffff08 != sVar3;
          in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 + 8) {
        std::
        vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ::push_back((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                     *)in_stack_fffffffffffffef0,(value_type *)__x);
        in_stack_fffffffffffffef0 =
             (vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *)
             llvm::DomTreeNodeBase<llvm::BasicBlock>::getBlock();
        std::vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::push_back
                  ((vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *)
                   in_RDI,(value_type *)in_stack_fffffffffffffed8);
      }
      __gnu_cxx::
      __normal_iterator<llvm::DomTreeNodeBase<llvm::BasicBlock>_**,_std::vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>_>
      ::operator++(&local_d8);
    }
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::swap((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
            *)in_stack_fffffffffffffef0,
           (vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
            *)__x);
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::~vector((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               *)in_stack_fffffffffffffef0);
  }
  local_11 = 1;
  std::
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::~vector((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
             *)in_stack_fffffffffffffef0);
  llvm::DominatorTreeWrapperPass::~DominatorTreeWrapperPass(in_RDI);
  if ((local_11 & 1) == 0) {
    std::vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::~vector
              (in_stack_fffffffffffffef0);
  }
  return (vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *)in_RDI;
}

Assistant:

std::vector<const llvm::BasicBlock *>
getBasicBlocksInDominatorOrder(llvm::Function &F) {
    std::vector<const llvm::BasicBlock *> blocks;
    blocks.reserve(F.size());

#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 9))
    llvm::DominatorTree DTree;
    DTree.recalculate(F);
#else
    llvm::DominatorTreeWrapperPass wrapper;
    wrapper.runOnFunction(F);
    auto &DTree = wrapper.getDomTree();
#ifndef NDEBUG
    wrapper.verifyAnalysis();
#endif
#endif

    auto *root_node = DTree.getRootNode();
    blocks.push_back(root_node->getBlock());

    std::vector<llvm::DomTreeNode *> to_process;
    to_process.reserve(4);
    to_process.push_back(root_node);

    while (!to_process.empty()) {
        std::vector<llvm::DomTreeNode *> new_to_process;
        new_to_process.reserve(to_process.size());

        for (auto *cur_node : to_process) {
            for (auto *child : *cur_node) {
                new_to_process.push_back(child);
                blocks.push_back(child->getBlock());
            }
        }

        to_process.swap(new_to_process);
    }

    return blocks;
}